

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTIMULSM9DS0.cpp
# Opt level: O2

bool __thiscall RTIMULSM9DS0::setCompassCTRL5(RTIMULSM9DS0 *this)

{
  uint uVar1;
  RTIMUSettings *this_00;
  bool bVar2;
  
  this_00 = (this->super_RTIMU).m_settings;
  uVar1 = this_00->m_LSM9DS0CompassSampleRate;
  if (uVar1 < 6) {
    bVar2 = RTIMUHal::HALWrite(&this_00->super_RTIMUHal,this->m_accelCompassSlaveAddr,'$',
                               (char)uVar1 << 2,"Failed to set LSM9DS0 compass CTRL5");
    return bVar2;
  }
  fprintf(_stderr,"Illegal LSM9DS0 compass sample rate code %d\n");
  return false;
}

Assistant:

bool RTIMULSM9DS0::setCompassCTRL5()
{
    unsigned char ctrl5;

    if ((m_settings->m_LSM9DS0CompassSampleRate < 0) || (m_settings->m_LSM9DS0CompassSampleRate > 5)) {
        HAL_ERROR1("Illegal LSM9DS0 compass sample rate code %d\n", m_settings->m_LSM9DS0CompassSampleRate);
        return false;
    }

    ctrl5 = (m_settings->m_LSM9DS0CompassSampleRate << 2);

#ifdef LSM9DS0_CACHE_MODE
    //  enable fifo

    ctrl5 |= 0x40;
#endif

    return m_settings->HALWrite(m_accelCompassSlaveAddr,  LSM9DS0_CTRL5, ctrl5, "Failed to set LSM9DS0 compass CTRL5");
}